

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::Version::Clear(Version *this)

{
  bool bVar1;
  string *default_value;
  LogMessage *other;
  LogFinisher local_8d [20];
  byte local_79;
  LogMessage local_78;
  Version *local_40;
  Version *this_local;
  HasBits<1UL> *local_30;
  HasBits<1UL> *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_40 = this;
  bVar1 = has_suffix(this);
  if (bVar1) {
    default_value = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    bVar1 = internal::ArenaStringPtr::IsDefault(&this->suffix_,default_value);
    local_79 = 0;
    if (bVar1) {
      internal::LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
                 ,0x121);
      local_79 = 1;
      other = internal::LogMessage::operator<<
                        (&local_78,
                         "CHECK failed: !suffix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                        );
      internal::LogFinisher::operator=(local_8d,other);
    }
    if ((local_79 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_78);
    }
    internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->suffix_);
    std::__cxx11::string::clear();
  }
  local_30 = &this->_has_bits_;
  this_local._4_4_ = 0;
  if ((local_30->has_bits_[0] & 0xe) != 0) {
    memset(&this->major_,0,0xc);
  }
  local_28 = &this->_has_bits_;
  memset(local_28,0,4);
  local_20 = &this->_internal_metadata_;
  if (((uint)(local_20->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_18 = local_20;
    local_10 = local_20;
    internal::InternalMetadataWithArena::DoClear(local_20);
  }
  return;
}

Assistant:

void Version::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.compiler.Version)
  if (has_suffix()) {
    GOOGLE_DCHECK(!suffix_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
    (*suffix_.UnsafeRawStringPointer())->clear();
  }
  if (_has_bits_[0 / 32] & 14u) {
    ::memset(&major_, 0, reinterpret_cast<char*>(&patch_) -
      reinterpret_cast<char*>(&major_) + sizeof(patch_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}